

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::Fail
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this,HRESULT error)

{
  bool isBody;
  code *pcVar1;
  bool bVar2;
  ParseError *this_00;
  EncodedChar *pEVar3;
  undefined4 *puVar4;
  EncodedChar *pEVar5;
  ulong uVar6;
  ulong uVar7;
  
  this_00 = (ParseError *)__cxa_allocate_exception(0x10);
  isBody = this->inBody;
  pEVar3 = this->input;
  pEVar5 = this->next;
  uVar7 = (long)pEVar5 - (long)pEVar3;
  uVar6 = uVar7;
  if (pEVar5 < pEVar3 || 0xfffffffd < (long)uVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                       ,0x9c,"(ph >= pl && ph - pl <= MaxCharCount)",
                       "ph >= pl && ph - pl <= MaxCharCount");
    if (!bVar2) goto LAB_00eb35b2;
    *puVar4 = 0;
    pEVar3 = this->input;
    pEVar5 = this->next;
    uVar6 = (long)pEVar5 - (long)pEVar3;
  }
  if (pEVar5 < pEVar3 || 0xfffffffd < (long)uVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                       ,0x9c,"(ph >= pl && ph - pl <= MaxCharCount)",
                       "ph >= pl && ph - pl <= MaxCharCount");
    if (!bVar2) {
LAB_00eb35b2:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  ParseError::ParseError(this_00,isBody,(CharCount)(uVar7 >> 1),(CharCount)(uVar6 >> 1),error);
  __cxa_throw(this_00,&ParseError::typeinfo,0);
}

Assistant:

void Parser<P, IsLiteral>::Fail(HRESULT error)
    {
        throw ParseError(inBody, Pos(), Chars<EncodedChar>::OSB(next, input), error);
    }